

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

Var Js::TypedArrayBase::EntryFilter(RecyclableObject *function,CallInfo callInfo,...)

{
  ImplicitCallFlags IVar1;
  int iVar2;
  ScriptContext *pSVar3;
  ThreadContext *pTVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  BOOL BVar9;
  Attributes attributes;
  undefined4 *puVar10;
  TypedArrayBase *pTVar11;
  Var pvVar12;
  RecyclableObject *pRVar13;
  TempGuestArenaAllocatorObject *tempGuestAllocator;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this;
  undefined4 extraout_var;
  JavascriptMethod p_Var14;
  uint64 uVar15;
  uint64 uVar16;
  JavascriptFunction *defaultConstructor;
  JavascriptFunction *instanceObj;
  Type *ppvVar17;
  uint32 uVar18;
  ulong uVar19;
  uint32 index;
  ulong uVar20;
  uint index_00;
  int in_stack_00000010;
  undefined1 local_f0 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  anon_class_24_3_e6d59889_for_newObjectCreationFunction local_b8;
  anon_class_24_3_e6d59889_for_newObjectCreationFunction local_a0;
  ulong local_88;
  RecyclableObject *local_80;
  undefined4 *local_78;
  undefined1 local_70 [8];
  ArgumentReader args;
  
  pSVar3 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar3->threadContext,0xc00,pSVar3,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x69a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar6) goto LAB_00d5b4da;
    *puVar10 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_70 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_70,(CallInfo *)&__tag.entry.next);
  pSVar3 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_f0,function,(CallInfo)__tag.entry.next,
             L"[TypedArray].prototype.filter",&stack0x00000000);
  if (((ulong)__tag.entry.next & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x69e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar6) goto LAB_00d5b4da;
    *puVar10 = 0;
  }
  pTVar11 = ValidateTypedArray((Arguments *)local_70,pSVar3,L"[TypedArray].prototype.filter");
  if (((ulong)local_70 & 0xfffffe) == 0) {
LAB_00d5b4dc:
    JavascriptError::ThrowTypeError(pSVar3,-0x7ff5ec34,L"[TypedArray].prototype.filter");
  }
  local_88 = (ulong)(pTVar11->super_ArrayBufferParent).super_ArrayObject.length;
  pvVar12 = Arguments::operator[]((Arguments *)local_70,1);
  bVar6 = JavascriptConversion::IsCallable(pvVar12);
  if (!bVar6) goto LAB_00d5b4dc;
  pvVar12 = Arguments::operator[]((Arguments *)local_70,1);
  pRVar13 = VarTo<Js::RecyclableObject>(pvVar12);
  if ((local_70._0_4_ & 0xffffff) < 3) {
    local_80 = (((pSVar3->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
  }
  else {
    local_80 = (RecyclableObject *)Arguments::operator[]((Arguments *)local_70,2);
  }
  tempGuestAllocator = ScriptContext::GetTemporaryGuestAllocator(pSVar3,L"Runtime");
  uVar18 = 0;
  this = (List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
         new<Memory::ArenaAllocator>(0x30,&tempGuestAllocator->allocator,0x364470);
  (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).alloc =
       &tempGuestAllocator->allocator;
  (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>)._vptr_ReadOnlyList =
       (_func_int **)&PTR_IsReadOnly_014dbfd8;
  (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer = (Type)0x0;
  (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
  this->length = 0;
  this->increment = 4;
  if (local_88 != 0) {
    local_78 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar20 = 0;
    do {
      iVar8 = (*(pTVar11->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(pTVar11,uVar20 & 0xffffffff);
      pTVar4 = pSVar3->threadContext;
      bVar6 = pTVar4->reentrancySafeOrHandled;
      pTVar4->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar4);
      if (pSVar3->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var14 = RecyclableObject::GetEntryPoint(pRVar13);
      CheckIsExecutable(pRVar13,p_Var14);
      p_Var14 = RecyclableObject::GetEntryPoint(pRVar13);
      if ((int)uVar20 < 0) {
        args.super_Arguments.Values = (Type)(double)(uVar20 & 0xffffffff);
        uVar15 = NumberUtilities::ToSpecial((double)args.super_Arguments.Values);
        bVar7 = NumberUtilities::IsNan((double)args.super_Arguments.Values);
        if (((bVar7) &&
            (uVar16 = NumberUtilities::ToSpecial((double)args.super_Arguments.Values),
            uVar16 != 0xfff8000000000000)) &&
           (uVar16 = NumberUtilities::ToSpecial((double)args.super_Arguments.Values),
           uVar16 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_78 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar7) goto LAB_00d5b4da;
          *local_78 = 0;
        }
        uVar19 = uVar15 ^ 0xfffc000000000000;
      }
      else {
        uVar19 = uVar20 + 0x1000000000000;
      }
      pvVar12 = (*p_Var14)(pRVar13,(CallInfo)pRVar13,0x2000004,0,0,0,0,0x2000004,local_80,
                           (void *)CONCAT44(extraout_var,iVar8),uVar19,pTVar11);
      pTVar4->reentrancySafeOrHandled = bVar6;
      BVar9 = JavascriptConversion::ToBoolean(pvVar12,pSVar3);
      if (BVar9 != 0) {
        JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
        EnsureArray(this,0);
        iVar2 = (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
        (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer[iVar2] =
             (void *)CONCAT44(extraout_var,iVar8);
        (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count =
             iVar2 + 1;
      }
      uVar20 = uVar20 + 1;
    } while (local_88 != uVar20);
    uVar18 = (this->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
  }
  pvVar12 = Arguments::operator[]((Arguments *)local_70,0);
  defaultConstructor = GetDefaultConstructor(pvVar12,pSVar3);
  instanceObj = (JavascriptFunction *)
                JavascriptOperators::SpeciesConstructor
                          ((RecyclableObject *)pTVar11,defaultConstructor,pSVar3);
  bVar6 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x6dd,"(JavascriptOperators::IsConstructor(constructor))",
                                "JavascriptOperators::IsConstructor(constructor)");
    if (!bVar6) {
LAB_00d5b4da:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar10 = 0;
  }
  pTVar4 = pSVar3->threadContext;
  local_a0.constructor = (RecyclableObject *)instanceObj;
  local_a0.captured = uVar18;
  local_a0.scriptContext = pSVar3;
  if (instanceObj == defaultConstructor) {
    bVar6 = pTVar4->reentrancySafeOrHandled;
    pTVar4->reentrancySafeOrHandled = true;
    pRVar13 = (RecyclableObject *)
              anon_func::anon_class_24_1_2f014396::
              anon_class_24_3_e6d59889_for_newObjectCreationFunction::operator()(&local_a0);
    pTVar4->reentrancySafeOrHandled = bVar6;
    goto LAB_00d5b3fd;
  }
  local_b8._12_4_ = local_a0._12_4_;
  bVar6 = pTVar4->reentrancySafeOrHandled;
  pTVar4->reentrancySafeOrHandled = true;
  local_b8.constructor = (RecyclableObject *)instanceObj;
  local_b8.captured = uVar18;
  local_b8.scriptContext = pSVar3;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)instanceObj);
  bVar7 = ThreadContext::HasNoSideEffect(pTVar4,(RecyclableObject *)instanceObj,attributes);
  if (bVar7) {
    pRVar13 = (RecyclableObject *)
              anon_func::anon_class_24_1_2f014396::
              anon_class_24_3_e6d59889_for_newObjectCreationFunction::operator()(&local_b8);
    bVar7 = ThreadContext::IsOnStack(pRVar13);
LAB_00d5b368:
    if (bVar7 != false) {
      pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((pTVar4->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      pRVar13 = (RecyclableObject *)
                anon_func::anon_class_24_1_2f014396::
                anon_class_24_3_e6d59889_for_newObjectCreationFunction::operator()(&local_b8);
      bVar7 = ThreadContext::IsOnStack(pRVar13);
      goto LAB_00d5b368;
    }
    IVar1 = pTVar4->implicitCallFlags;
    pRVar13 = (RecyclableObject *)
              anon_func::anon_class_24_1_2f014396::
              anon_class_24_3_e6d59889_for_newObjectCreationFunction::operator()(&local_b8);
    pTVar4->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
    pRVar13 = (((((((((instanceObj->super_DynamicObject).super_RecyclableObject.type.ptr)->
                    javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
              undefinedValue.ptr;
  }
  pTVar4->reentrancySafeOrHandled = bVar6;
LAB_00d5b3fd:
  pRVar13 = VarTo<Js::RecyclableObject>(pRVar13);
  bVar6 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(pRVar13);
  if ((bVar6) &&
     (pTVar11 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(pRVar13),
     pTVar11 != (TypedArrayBase *)0x0)) {
    if (uVar18 != 0) {
      index_00 = 0;
      do {
        ppvVar17 = JsUtil::
                   List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ::Item(this,index_00);
        (*(pTVar11->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
          super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x70])(pTVar11,(ulong)index_00,*ppvVar17);
        index_00 = index_00 + 1;
      } while (uVar18 != index_00);
    }
  }
  else if (uVar18 != 0) {
    index = 0;
    do {
      ppvVar17 = JsUtil::
                 List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this,index);
      JavascriptOperators::OP_SetElementI_UInt32
                (pRVar13,index,*ppvVar17,pSVar3,PropertyOperation_ThrowIfNotExtensible);
      index = index + 1;
    } while (uVar18 != index);
  }
  ScriptContext::ReleaseTemporaryGuestAllocator(pSVar3,tempGuestAllocator);
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_f0);
  return pRVar13;
}

Assistant:

Var TypedArrayBase::EntryFilter(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("[TypedArray].prototype.filter"));

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(TypedArray_Prototype_filter);

        TypedArrayBase* typedArrayBase = ValidateTypedArray(args, scriptContext, _u("[TypedArray].prototype.filter"));
        uint32 length = typedArrayBase->GetLength();

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.filter"));
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        Var element = nullptr;
        Var selected = nullptr;
        RecyclableObject* newObj = nullptr;

        DECLARE_TEMP_GUEST_ALLOCATOR(tempAlloc);

        ACQUIRE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"));
        {
            // Create a temporary list to hold the items selected by the callback function.
            // We will then iterate over this list and append those items into the object we will return.
            // We have to collect the items into this temporary list because we need to call the
            // new object constructor with a length of items and we don't know what length will be
            // until we know how many items we will collect.
            JsUtil::List<Var, ArenaAllocator>* tempList = JsUtil::List<Var, ArenaAllocator>::New(tempAlloc);

            for (uint32 k = 0; k < length; k++)
            {
                // We know that the TypedArray.HasItem will be true because k < length and we can skip the check in the TypedArray version of filter.
                element = typedArrayBase->DirectGetItem(k);

                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    selected = CALL_FUNCTION(scriptContext->GetThreadContext(),
                                    callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                    element,
                                    JavascriptNumber::ToVar(k, scriptContext),
                                    typedArrayBase);
                }
                END_SAFE_REENTRANT_CALL

                if (JavascriptConversion::ToBoolean(selected, scriptContext))
                {
                    tempList->Add(element);
                }
            }

            uint32 captured = tempList->Count();

            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext);
            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            newObj = VarTo<RecyclableObject>(JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
            {
                Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(captured, scriptContext) };
                Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), captured, scriptContext);
            }));

            TypedArrayBase* newArr = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);
            if (newArr)
            {
                // We are much more likely to have a TypedArray here than anything else

                for (uint32 i = 0; i < captured; i++)
                {
                    newArr->DirectSetItem(i, tempList->Item(i));
                }
            }
            else
            {
                for (uint32 i = 0; i < captured; i++)
                {
                    JavascriptOperators::OP_SetElementI_UInt32(newObj, i, tempList->Item(i), scriptContext, PropertyOperation_ThrowIfNotExtensible);
                }
            }
        }
        RELEASE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext);

        return newObj;
    }